

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::passwordMode(Config *this,string *parameter)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_39;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *parameter_local;
  Config *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  bVar1 = std::operator==(parameter,"bytes");
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    peVar2->password_mode = pm_bytes;
  }
  else {
    bVar1 = std::operator==(local_18,"hex-bytes");
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
      peVar2->password_mode = pm_hex_bytes;
    }
    else {
      bVar1 = std::operator==(local_18,"unicode");
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
        peVar2->password_mode = pm_unicode;
      }
      else {
        bVar1 = std::operator==(local_18,"auto");
        if (bVar1) {
          peVar2 = std::
                   __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this->o);
          peVar2->password_mode = pm_auto;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"invalid password-mode option",&local_39);
          usage(&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          std::allocator<char>::~allocator(&local_39);
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::passwordMode(std::string const& parameter)
{
    if (parameter == "bytes") {
        o.m->password_mode = QPDFJob::pm_bytes;
    } else if (parameter == "hex-bytes") {
        o.m->password_mode = QPDFJob::pm_hex_bytes;
    } else if (parameter == "unicode") {
        o.m->password_mode = QPDFJob::pm_unicode;
    } else if (parameter == "auto") {
        o.m->password_mode = QPDFJob::pm_auto;
    } else {
        usage("invalid password-mode option");
    }
    return this;
}